

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialization_pipeline<TreesIndexer,char*>(TreesIndexer *model,char **out)

{
  char *saved_position;
  char *saved_position_00;
  char **in_RSI;
  TreesIndexer *in_RDI;
  char *end_pos;
  size_t jump_ahead;
  uint8_t ending_type;
  size_t size_model;
  uint8_t model_type;
  char *pos_watermark;
  SignalSwitcher ss;
  size_t in_stack_ffffffffffffff98;
  SignalSwitcher *in_stack_ffffffffffffffa0;
  SignalSwitcher *this;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 full_watermark;
  SignalSwitcher *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  TreesIndexer *in_stack_ffffffffffffffc0;
  
  full_watermark = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  SignalSwitcher::SignalSwitcher(in_stack_ffffffffffffffa0);
  saved_position = set_return_position(*in_RSI);
  add_setup_info<char*>((char **)in_stack_ffffffffffffffb0,(bool)full_watermark);
  get_model_code(in_RDI);
  this = (SignalSwitcher *)0x1;
  write_bytes<unsigned_char>((void *)0x1,in_stack_ffffffffffffff98,(char **)0x64ff9d);
  get_size_model(in_stack_ffffffffffffffc0);
  write_bytes<unsigned_long>(this,in_stack_ffffffffffffff98,(char **)0x64ffc0);
  serialize_model<char*>
            (in_stack_ffffffffffffffc0,
             (char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  check_interrupt_switch(in_stack_ffffffffffffffb0);
  write_bytes<unsigned_char>(this,in_stack_ffffffffffffff98,(char **)0x64fff6);
  write_bytes<unsigned_long>(this,in_stack_ffffffffffffff98,(char **)0x650013);
  saved_position_00 = set_return_position(*in_RSI);
  return_to_position(in_RSI,saved_position);
  add_full_watermark<char*>((char **)0x65003e);
  return_to_position(in_RSI,saved_position_00);
  SignalSwitcher::~SignalSwitcher(this);
  return;
}

Assistant:

void serialization_pipeline(const Model &model, otype &out)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);
    
    add_setup_info(out, false);
    uint8_t model_type = get_model_code(model);
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);
    size_t size_model = get_size_model(model);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);
    serialize_model(model, out);
    check_interrupt_switch(ss);

    /* This last bit will be left open in order to signal if anything follows,
       in case it's decided to change the format in the future or to add
       something additional, along with a 'size_t' slot in case it would need
       to jump ahead or something like that. */
    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}